

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O2

void __thiscall
ResourcesDictionary::AddExtGStateMapping
          (ResourcesDictionary *this,ObjectIDType inExtGStateID,string *inExtGStateName)

{
  iterator iVar1;
  ObjectIDType local_48;
  undefined1 local_40 [40];
  
  local_48 = inExtGStateID;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->mExtGStates)._M_t,&local_48);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mExtGStates)._M_t._M_impl.super__Rb_tree_header) {
    local_40._0_8_ = local_48;
    std::__cxx11::string::string((string *)(local_40 + 8),(string *)inExtGStateName);
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<unsigned_long_const,std::__cxx11::string>>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                *)&this->mExtGStates,
               (pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_40);
    std::__cxx11::string::~string((string *)(local_40 + 8));
  }
  else {
    std::__cxx11::string::_M_assign((string *)&iVar1._M_node[1]._M_parent);
  }
  return;
}

Assistant:

void ResourcesDictionary::AddExtGStateMapping(ObjectIDType inExtGStateID, const std::string& inExtGStateName)
{
	ObjectIDTypeToStringMap::iterator it = mExtGStates.find(inExtGStateID);

	if(it == mExtGStates.end())
		mExtGStates.insert(ObjectIDTypeToStringMap::value_type(inExtGStateID,inExtGStateName));
	else
		it->second = inExtGStateName;
}